

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O1

c_float * vec_copy(c_float *a,c_int n)

{
  c_float *pcVar1;
  
  pcVar1 = (c_float *)malloc(n * 8);
  if (pcVar1 == (c_float *)0x0) {
    pcVar1 = (c_float *)0x0;
  }
  else if (0 < n) {
    pcVar1 = (c_float *)memcpy(pcVar1,a,n * 8);
    return pcVar1;
  }
  return pcVar1;
}

Assistant:

c_float* vec_copy(c_float *a, c_int n) {
  c_float *b;
  c_int    i;

  b = c_malloc(n * sizeof(c_float));
  if (!b) return OSQP_NULL;

  for (i = 0; i < n; i++) {
    b[i] = a[i];
  }

  return b;
}